

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O3

void __thiscall nodecpp::platform::internal_msg::InternalMsg::impl_clear(InternalMsg *this)

{
  implReleaseAllPages(this);
  if (this->pageCnt != 0) {
    assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
               ,0x180,"pageCnt == 0",true);
  }
  (this->firstHeader).super_IndexPageHeader.next_.ptr = (uint8_t *)0x0;
  (this->lip).ptr = (uint8_t *)0x0;
  (this->currentPage).ptr = (uint8_t *)0x0;
  this->totalSz = 0;
  return;
}

Assistant:

void impl_clear() 
		{
			implReleaseAllPages();
			NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, pageCnt == 0 );
			firstHeader.next_.init();
			lip.init();
			currentPage.init();
			totalSz = 0;
		}